

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O3

void uWS::WebSocket<true>::onData(Socket s,char *data,int length)

{
  void *pvVar1;
  int iVar2;
  undefined4 in_register_00000004;
  undefined8 local_28;
  
  pvVar1 = (s.p)->data;
  *(undefined1 *)((long)pvVar1 + 0xa1) = 0;
  if (*(char *)((long)pvVar1 + 0x1c) == '\0') {
    local_28 = CONCAT44(in_register_00000004,1);
    setsockopt(((s.p)->io_watcher).fd,6,3,&local_28,4);
    WebSocketProtocol<true>::consume
              ((WebSocketProtocol<true> *)((long)pvVar1 + 0x40),data,length,s.p);
    iVar2 = uv_is_closing(s.p);
    if (iVar2 == 0) {
      local_28 = local_28 & 0xffffffff;
      setsockopt(((s.p)->io_watcher).fd,6,3,(void *)((long)&local_28 + 4),4);
    }
  }
  return;
}

Assistant:

void WebSocket<isServer>::sendPrepared(typename WebSocket<isServer>::PreparedMessage *preparedMessage, void *callbackData) {
    preparedMessage->references++;
    void (*callback)(void *webSocket, void *userData, bool cancelled, void *reserved) = [](void *webSocket, void *userData, bool cancelled, void *reserved) {
        PreparedMessage *preparedMessage = (PreparedMessage *) userData;
        bool lastReference = !--preparedMessage->references;

        if (preparedMessage->callback) {
            preparedMessage->callback(webSocket, reserved, cancelled, (void *) lastReference);
        }

        if (lastReference) {
            delete [] preparedMessage->buffer;
            delete preparedMessage;
        }
    };

    // candidate for fixed size pool allocator
    int memoryLength = sizeof(uS::SocketData::Queue::Message);
    int memoryIndex = getSocketData()->nodeData->getMemoryBlockIndex(memoryLength);

    uS::SocketData::Queue::Message *messagePtr = (uS::SocketData::Queue::Message *) getSocketData()->nodeData->getSmallMemoryBlock(memoryIndex);
    messagePtr->data = preparedMessage->buffer;
    messagePtr->length = preparedMessage->length;

    bool wasTransferred;
    if (write(messagePtr, wasTransferred)) {
        if (!wasTransferred) {
            getSocketData()->nodeData->freeSmallMemoryBlock((char *) messagePtr, memoryIndex);
            if (callback) {
                callback(*this, preparedMessage, false, callbackData);
            }
        } else {
            messagePtr->callback = callback;
            messagePtr->callbackData = preparedMessage;
            messagePtr->reserved = callbackData;
        }
    } else {
        if (callback) {
            callback(*this, preparedMessage, true, callbackData);
        }
    }
}